

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>::
find<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Entry,kj::PathPtr&>
          (HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
           *this,ArrayPtr<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>
                 table,PathPtr *params)

{
  undefined8 *puVar1;
  int iVar2;
  size_t sVar3;
  String *pSVar4;
  uchar *puVar5;
  bool bVar6;
  uint uVar7;
  Disposer *pDVar8;
  uint uVar9;
  ArrayDisposer *pAVar10;
  uchar *puVar11;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar12;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  uint uVar13;
  ulong uVar14;
  Disposer *pDVar15;
  Entry *pEVar16;
  uchar *puVar17;
  ArrayPtr<const_kj::String> *in_R8;
  long lVar18;
  ArrayDisposer *pAVar19;
  Maybe<unsigned_long> MVar20;
  ArrayPtr<const_unsigned_char> s;
  PathPtr local_40;
  
  pEVar16 = table.ptr;
  pDVar8 = (pEVar16->value).dir.disposer;
  aVar12.value = table.size_;
  if (pDVar8 != (Disposer *)0x0) {
    sVar3 = in_R8->size_;
    uVar13 = (int)sVar3 * 4;
    if (sVar3 != 0) {
      pSVar4 = in_R8->ptr;
      lVar18 = 0;
      do {
        puVar5 = *(uchar **)((long)&(pSVar4->content).size_ + lVar18);
        puVar17 = puVar5;
        if (puVar5 != (uchar *)0x0) {
          puVar17 = *(uchar **)((long)&(pSVar4->content).ptr + lVar18);
        }
        puVar11 = (uchar *)0x0;
        if (puVar5 != (uchar *)0x0) {
          puVar11 = puVar5 + -1;
        }
        s.size_ = (size_t)puVar11;
        s.ptr = puVar17;
        uVar7 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
        uVar13 = uVar13 * 0x5bd1e995 ^
                 (uVar7 * 0x5bd1e995 >> 0x18 ^ uVar7 * 0x5bd1e995) * 0x5bd1e995;
        lVar18 = lVar18 + 0x18;
      } while (sVar3 * 0x18 != lVar18);
      pDVar8 = (pEVar16->value).dir.disposer;
    }
    uVar9 = (uVar13 >> 0xd ^ uVar13) * 0x5bd1e995;
    uVar9 = uVar9 >> 0xf ^ uVar9;
    uVar14 = (ulong)((int)pDVar8 - 1U & uVar9);
    pAVar10 = (pEVar16->key).parts.disposer;
    uVar13 = *(uint *)((long)&pAVar10[uVar14]._vptr_ArrayDisposer + 4);
    aVar12.value._4_4_ = 0;
    aVar12.value._0_4_ = uVar13;
    if (uVar13 != 0) {
      pAVar19 = pAVar10 + uVar14;
      do {
        if (((int)aVar12.value != 1) && (*(uint *)&pAVar19->_vptr_ArrayDisposer == uVar9)) {
          puVar1 = (undefined8 *)(table.size_ + (ulong)((int)aVar12.value - 2) * 0x30);
          local_40.parts.ptr = (String *)*puVar1;
          local_40.parts.size_ = puVar1[1];
          bVar6 = PathPtr::operator==(&local_40,(PathPtr)*in_R8);
          if (bVar6) {
            iVar2 = *(int *)((long)&pAVar19->_vptr_ArrayDisposer + 4);
            *this = (HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
                     )0x1;
            *(ulong *)(this + 8) = (ulong)(iVar2 - 2);
            aVar12 = extraout_RDX;
            goto LAB_0011a901;
          }
          pAVar10 = (pEVar16->key).parts.disposer;
          pDVar8 = (pEVar16->value).dir.disposer;
        }
        pDVar15 = (Disposer *)(uVar14 + 1);
        uVar14 = (ulong)pDVar15 & 0xffffffff;
        if (pDVar15 == pDVar8) {
          uVar14 = 0;
        }
        pAVar19 = pAVar10 + uVar14;
        uVar13 = *(uint *)((long)&pAVar19->_vptr_ArrayDisposer + 4);
        aVar12.value._4_4_ = 0;
        aVar12.value._0_4_ = uVar13;
      } while (uVar13 != 0);
    }
  }
  *this = (HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
           )0x0;
LAB_0011a901:
  MVar20.ptr.field_1.value = aVar12.value;
  MVar20.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar20.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }